

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_copyWithin(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  byte bVar1;
  JSValueUnion JVar2;
  int max;
  int iVar3;
  ulong uVar4;
  int64_t iVar5;
  ulong uVar6;
  JSRefCountHeader *p;
  JSValue JVar7;
  JSValue val;
  int final;
  int from;
  int to;
  int local_44;
  JSValueUnion local_40;
  int local_38;
  int local_34;
  
  iVar5 = this_val.tag;
  max = js_typed_array_get_length_internal(ctx,this_val);
  if ((((max < 0) ||
       (local_40 = this_val.u, iVar3 = JS_ToInt32Clamp(ctx,&local_34,*argv,0,max,max), iVar3 != 0))
      || (iVar3 = JS_ToInt32Clamp(ctx,&local_38,argv[1],0,max,max), iVar3 != 0)) ||
     (((local_44 = max, 2 < argc && ((int)argv[2].tag != 3)) &&
      (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
      iVar3 = JS_ToInt32Clamp(ctx,&local_44,val,0,max,max), iVar3 != 0)))) {
LAB_0016afb3:
    uVar6 = 0;
    uVar4 = 0;
    iVar5 = 6;
  }
  else {
    JVar2 = local_40;
    iVar3 = max - local_34;
    if (local_44 - local_38 < max - local_34) {
      iVar3 = local_44 - local_38;
    }
    if (0 < iVar3) {
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)local_40.ptr + 0x30) + 0x18) + 0x30) + 4) !=
          '\0') {
        JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        goto LAB_0016afb3;
      }
      bVar1 = "includes"[(ulong)*(ushort *)((long)local_40.ptr + 6) + 1];
      memmove((void *)((long)(local_34 << (bVar1 & 0x1f)) + *(long *)((long)local_40.ptr + 0x38)),
              (void *)((long)(local_38 << (bVar1 & 0x1f)) + *(long *)((long)local_40.ptr + 0x38)),
              (long)(iVar3 << (bVar1 & 0x1f)));
    }
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
    }
    uVar4 = (ulong)JVar2.ptr & 0xffffffff00000000;
    uVar6 = (ulong)JVar2.ptr & 0xffffffff;
  }
  JVar7.tag = iVar5;
  JVar7.u.ptr = (void *)(uVar6 | uVar4);
  return JVar7;
}

Assistant:

static JSValue js_typed_array_copyWithin(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, to, from, final, count, shift;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &to, argv[0], 0, len, len))
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &from, argv[1], 0, len, len))
        return JS_EXCEPTION;

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    count = min_int(final - from, len - to);
    if (count > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        if (typed_array_is_detached(ctx, p))
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        shift = typed_array_size_log2(p->class_id);
        memmove(p->u.array.u.uint8_ptr + (to << shift),
                p->u.array.u.uint8_ptr + (from << shift),
                count << shift);
    }
    return JS_DupValue(ctx, this_val);
}